

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Mf_Man_t * Mf_ManAlloc(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  Mf_Man_t *pMVar2;
  Vec_Mem_t *pVVar3;
  Mf_Obj_t *pMVar4;
  void **ppvVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  abctime aVar8;
  long lVar9;
  int iVar10;
  timespec ts;
  timespec local_28;
  
  iVar10 = (int)&local_28;
  if (0xe < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= MF_CUT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x52e,"Mf_Man_t *Mf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (8 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= MF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x52f,"Mf_Man_t *Mf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  pVVar7 = pGia->vMapping;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pGia->vMapping->pArray = (int *)0x0;
      pVVar7 = pGia->vMapping;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_0072342b;
    }
    free(pVVar7);
    pGia->vMapping = (Vec_Int_t *)0x0;
  }
LAB_0072342b:
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  pMVar2 = (Mf_Man_t *)calloc(1,0xc0);
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    aVar8 = -1;
  }
  else {
    aVar8 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  pMVar2->clkStart = aVar8;
  pMVar2->pGia = pGia;
  pMVar2->pPars = pPars;
  if (pPars->fCutMin == 0) {
    pVVar3 = (Vec_Mem_t *)0x0;
  }
  else {
    pVVar3 = Vec_MemAllocForTT(pPars->nLutSize,iVar10);
  }
  pMVar2->vTtMem = pVVar3;
  pMVar4 = (Mf_Obj_t *)calloc((long)pGia->nObjs,0x10);
  pMVar2->pLfObjs = pMVar4;
  pMVar2->iCur = 2;
  ppvVar5 = (void **)malloc(0x800);
  (pMVar2->vPages).pArray = ppvVar5;
  (pMVar2->vPages).nCap = 0x100;
  if (pPars->fGenCnf != 0) {
    piVar6 = (int *)malloc(40000);
    (pMVar2->vCnfSizes).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_00723613:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pMVar2->vCnfSizes).nCap = 10000;
    Vec_IntPush(&pMVar2->vCnfSizes,1);
    Vec_IntPush(&pMVar2->vCnfSizes,2);
    if ((pMVar2->vCnfMem).nCap < 10000) {
      piVar6 = (pMVar2->vCnfMem).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc(40000);
      }
      else {
        piVar6 = (int *)realloc(piVar6,40000);
      }
      (pMVar2->vCnfMem).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_00723613;
      (pMVar2->vCnfMem).nCap = 10000;
    }
  }
  pVVar7 = (Vec_Int_t *)calloc(1,0x10);
  Mf_ManSetFlowRefs(pGia,pVVar7);
  iVar10 = pVVar7->nSize;
  piVar6 = pVVar7->pArray;
  if ((long)iVar10 < 1) {
    if (piVar6 == (int *)0x0) goto LAB_007235c0;
  }
  else {
    pMVar4 = pMVar2->pLfObjs;
    lVar9 = 0;
    do {
      (&pMVar4->nFlowRefs)[lVar9] = (float)*(int *)((long)piVar6 + lVar9);
      lVar9 = lVar9 + 4;
    } while ((long)iVar10 * 4 != lVar9);
  }
  free(piVar6);
LAB_007235c0:
  free(pVVar7);
  return pMVar2;
}

Assistant:

Mf_Man_t * Mf_ManAlloc( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Mf_Man_t * p;
    Vec_Int_t * vFlowRefs;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= MF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= MF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    p = ABC_CALLOC( Mf_Man_t, 1 );
    p->clkStart  = Abc_Clock();
    p->pGia      = pGia;
    p->pPars     = pPars;
    p->vTtMem    = pPars->fCutMin ? Vec_MemAllocForTT( pPars->nLutSize, 0 ) : NULL;
    p->pLfObjs   = ABC_CALLOC( Mf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur      = 2;
    Vec_PtrGrow( &p->vPages, 256 );
    if ( pPars->fGenCnf )
    {
        Vec_IntGrow( &p->vCnfSizes, 10000 );
        Vec_IntPush( &p->vCnfSizes, 1 );
        Vec_IntPush( &p->vCnfSizes, 2 );
        Vec_IntGrow( &p->vCnfMem, 10000 );
    }
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
        p->pLfObjs[i].nFlowRefs = Entry;
    Vec_IntFree(vFlowRefs);
    return p;
}